

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_8x16(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  JSAMPROW pJVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  DCTELEM *pDVar20;
  long lVar21;
  int *piVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  long lVar34;
  DCTELEM workspace [64];
  int local_138 [8];
  int aiStack_118 [8];
  int aiStack_f8 [8];
  int aiStack_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  
  uVar9 = (ulong)start_col;
  lVar13 = 0;
  pDVar20 = data;
  do {
    pJVar8 = sample_data[lVar13];
    uVar29 = (uint)pJVar8[uVar9] + (uint)pJVar8[uVar9 + 7];
    uVar27 = (uint)pJVar8[uVar9 + 1] + (uint)pJVar8[uVar9 + 6];
    uVar32 = (uint)pJVar8[uVar9 + 2] + (uint)pJVar8[uVar9 + 5];
    uVar14 = (uint)pJVar8[uVar9 + 3] + (uint)pJVar8[uVar9 + 4];
    lVar17 = (ulong)uVar29 - (ulong)uVar14;
    iVar15 = uVar14 + uVar29;
    lVar30 = (ulong)uVar27 - (ulong)uVar32;
    iVar33 = uVar32 + uVar27;
    lVar31 = (ulong)pJVar8[uVar9] - (ulong)pJVar8[uVar9 + 7];
    lVar12 = (ulong)pJVar8[uVar9 + 1] - (ulong)pJVar8[uVar9 + 6];
    lVar26 = (ulong)pJVar8[uVar9 + 2] - (ulong)pJVar8[uVar9 + 5];
    lVar11 = (ulong)pJVar8[uVar9 + 3] - (ulong)pJVar8[uVar9 + 4];
    *pDVar20 = (iVar15 + iVar33) * 4 + -0x1000;
    pDVar20[4] = (iVar15 - iVar33) * 4;
    lVar21 = (lVar17 + lVar30) * 0x1151;
    pDVar20[2] = (int)(lVar17 * 0x187e + lVar21 + 0x400U >> 0xb);
    pDVar20[6] = (int)(lVar21 + lVar30 * 0x7ffffffc4df + 0x400U >> 0xb);
    lVar21 = (lVar11 + lVar12 + lVar26 + lVar31) * 0x25a1;
    lVar17 = (lVar26 + lVar31) * -0xc7c + lVar21;
    lVar21 = (lVar11 + lVar12) * -0x3ec5 + lVar21;
    lVar30 = (lVar11 + lVar31) * -0x1ccd;
    pDVar20[1] = (int)((ulong)(lVar31 * 0x300b + lVar30 + 0x400 + lVar17) >> 0xb);
    lVar31 = (lVar26 + lVar12) * -0x5203;
    pDVar20[3] = (int)((ulong)(lVar12 * 0x6254 + lVar31 + 0x400 + lVar21) >> 0xb);
    pDVar20[5] = (int)((ulong)(lVar26 * 0x41b3 + lVar31 + 0x400 + lVar17) >> 0xb);
    pDVar20[7] = (int)((ulong)(lVar11 * 0x98e + lVar30 + 0x400 + lVar21) >> 0xb);
    piVar22 = local_138;
    if ((int)lVar13 != 7) {
      if ((int)lVar13 == 0xf) {
        lVar13 = 0;
        do {
          iVar15 = aiStack_58[lVar13];
          iVar33 = data[lVar13];
          lVar23 = (long)(iVar15 + iVar33);
          iVar1 = aiStack_78[lVar13];
          lVar18 = (long)(iVar1 + data[lVar13 + 8]);
          iVar2 = aiStack_98[lVar13];
          iVar3 = local_138[lVar13];
          iVar4 = aiStack_118[lVar13];
          lVar17 = (long)(iVar4 + data[lVar13 + 0x30]);
          lVar12 = (long)(data[lVar13 + 0x38] + iVar3);
          lVar11 = lVar12 + lVar23;
          lVar23 = lVar23 - lVar12;
          lVar12 = lVar17 + lVar18;
          lVar18 = lVar18 - lVar17;
          lVar16 = (long)(iVar2 + data[lVar13 + 0x10]);
          iVar5 = aiStack_f8[lVar13];
          lVar21 = (long)(iVar5 + data[lVar13 + 0x28]);
          lVar17 = lVar21 + lVar16;
          lVar16 = lVar16 - lVar21;
          iVar6 = aiStack_b8[lVar13];
          lVar24 = (long)(iVar6 + data[lVar13 + 0x18]);
          iVar7 = aiStack_d8[lVar13];
          lVar30 = (long)(iVar7 + data[lVar13 + 0x20]);
          lVar21 = lVar30 + lVar24;
          lVar24 = lVar24 - lVar30;
          data[lVar13] = (DCTELEM)(lVar21 + lVar17 + lVar12 + lVar11 + 4U >> 3);
          lVar30 = (long)(iVar33 - iVar15);
          lVar28 = (long)(data[lVar13 + 8] - iVar1);
          lVar26 = (long)(data[lVar13 + 0x10] - iVar2);
          lVar31 = (long)(data[lVar13 + 0x18] - iVar6);
          lVar10 = (long)(data[lVar13 + 0x20] - iVar7);
          lVar19 = (long)(data[lVar13 + 0x28] - iVar5);
          lVar34 = (long)(data[lVar13 + 0x30] - iVar4);
          lVar25 = (long)(data[lVar13 + 0x38] - iVar3);
          data[lVar13 + 0x20] =
               (DCTELEM)((ulong)((lVar12 - lVar17) * 0x1151 + (lVar11 - lVar21) * 0x29cf + 0x8000)
                        >> 0x10);
          lVar11 = (lVar23 - lVar16) * 0x2c63 + (lVar24 - lVar18) * 0x8d4;
          data[lVar13 + 0x10] =
               (DCTELEM)((ulong)(lVar16 * 0x4587 + lVar11 + 0x8000 + lVar18 * 0x2e75) >> 0x10);
          data[lVar13 + 0x30] =
               (DCTELEM)((ulong)(lVar24 * 0xffffffffde07 + lVar11 + 0x8000 + lVar23 * 0xfffffffff93e
                                ) >> 0x10);
          lVar16 = (lVar34 - lVar25) * 0xd23 + (lVar28 + lVar30) * 0x2b4e;
          lVar11 = (lVar25 + lVar19) * 0x1555 + (lVar26 + lVar30) * 0x27e9;
          lVar18 = (lVar10 - lVar25) * 0x1cb6 + (lVar31 + lVar30) * 0x22fc;
          lVar17 = (lVar34 - lVar19) * 0x2d09 + (lVar26 + lVar28) * 0x470;
          lVar21 = (lVar34 + lVar10) * -0x27e9 + (lVar31 + lVar28) * -0x1555;
          lVar12 = (lVar19 - lVar10) * 0xd23 + (lVar31 + lVar26) * -0x2b4e;
          data[lVar13 + 8] =
               (DCTELEM)((ulong)(lVar25 * 0x18f3 + lVar30 * 0xffffffffb6d6 + lVar11 + lVar16 +
                                 lVar18 + 0x8000) >> 0x10);
          data[lVar13 + 0x18] =
               (DCTELEM)((ulong)(lVar16 + lVar17 + lVar34 * 0xffffffffcac1 + lVar28 * 0x24d + lVar21
                                + 0x8000) >> 0x10);
          data[lVar13 + 0x28] =
               (DCTELEM)((ulong)(lVar19 * 0x2747 + lVar17 + lVar26 * -0x2406 + lVar12 + 0x8000 +
                                lVar11) >> 0x10);
          data[lVar13 + 0x38] =
               (DCTELEM)((ulong)(lVar10 * 0x4560 + lVar21 + lVar31 * 0x2218 + lVar12 + 0x8000 +
                                lVar18) >> 0x10);
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 != 8);
        return;
      }
      piVar22 = pDVar20 + 8;
    }
    lVar13 = lVar13 + 1;
    pDVar20 = piVar22;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_8x16 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16, tmp17;
  INT32 z1;
  DCTELEM workspace[DCTSIZE2];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM) ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << PASS1_BITS);
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[2] = (DCTELEM) DESCALE(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				   CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				   CONST_BITS-PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM) DESCALE(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS);
    dataptr[7] = (DCTELEM) DESCALE(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == DCTSIZE * 2)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by 8/16 = 1/2.
   * 16-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/32).
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] + wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] + wsptr[DCTSIZE*0];

    tmp10 = tmp0 + tmp7;
    tmp14 = tmp0 - tmp7;
    tmp11 = tmp1 + tmp6;
    tmp15 = tmp1 - tmp6;
    tmp12 = tmp2 + tmp5;
    tmp16 = tmp2 - tmp5;
    tmp13 = tmp3 + tmp4;
    tmp17 = tmp3 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*7];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*6];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*5];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*4];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*3];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*2];
    tmp6 = dataptr[DCTSIZE*6] - wsptr[DCTSIZE*1];
    tmp7 = dataptr[DCTSIZE*7] - wsptr[DCTSIZE*0];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(tmp10 + tmp11 + tmp12 + tmp13, PASS1_BITS+1);
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(1.306562965)) + /* c4[16] = c2[8] */
	      MULTIPLY(tmp11 - tmp12, FIX_0_541196100),   /* c12[16] = c6[8] */
	      CONST_BITS+PASS1_BITS+1);

    tmp10 = MULTIPLY(tmp17 - tmp15, FIX(0.275899379)) +   /* c14[16] = c7[8] */
	    MULTIPLY(tmp14 - tmp16, FIX(1.387039845));    /* c2[16] = c1[8] */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp15, FIX(1.451774982))   /* c6+c14 */
	      + MULTIPLY(tmp16, FIX(2.172734804)),        /* c2+c10 */
	      CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp14, FIX(0.211164243))   /* c2-c6 */
	      - MULTIPLY(tmp17, FIX(1.061594338)),        /* c10+c14 */
	      CONST_BITS+PASS1_BITS+1);

    /* Odd part */

    tmp11 = MULTIPLY(tmp0 + tmp1, FIX(1.353318001)) +         /* c3 */
	    MULTIPLY(tmp6 - tmp7, FIX(0.410524528));          /* c13 */
    tmp12 = MULTIPLY(tmp0 + tmp2, FIX(1.247225013)) +         /* c5 */
	    MULTIPLY(tmp5 + tmp7, FIX(0.666655658));          /* c11 */
    tmp13 = MULTIPLY(tmp0 + tmp3, FIX(1.093201867)) +         /* c7 */
	    MULTIPLY(tmp4 - tmp7, FIX(0.897167586));          /* c9 */
    tmp14 = MULTIPLY(tmp1 + tmp2, FIX(0.138617169)) +         /* c15 */
	    MULTIPLY(tmp6 - tmp5, FIX(1.407403738));          /* c1 */
    tmp15 = MULTIPLY(tmp1 + tmp3, - FIX(0.666655658)) +       /* -c11 */
	    MULTIPLY(tmp4 + tmp6, - FIX(1.247225013));        /* -c5 */
    tmp16 = MULTIPLY(tmp2 + tmp3, - FIX(1.353318001)) +       /* -c3 */
	    MULTIPLY(tmp5 - tmp4, FIX(0.410524528));          /* c13 */
    tmp10 = tmp11 + tmp12 + tmp13 -
	    MULTIPLY(tmp0, FIX(2.286341144)) +                /* c7+c5+c3-c1 */
	    MULTIPLY(tmp7, FIX(0.779653625));                 /* c15+c13-c11+c9 */
    tmp11 += tmp14 + tmp15 + MULTIPLY(tmp1, FIX(0.071888074)) /* c9-c3-c15+c11 */
	     - MULTIPLY(tmp6, FIX(1.663905119));              /* c7+c13+c1-c5 */
    tmp12 += tmp14 + tmp16 - MULTIPLY(tmp2, FIX(1.125726048)) /* c7+c5+c15-c3 */
	     + MULTIPLY(tmp5, FIX(1.227391138));              /* c9-c11+c1-c13 */
    tmp13 += tmp15 + tmp16 + MULTIPLY(tmp3, FIX(1.065388962)) /* c15+c3+c11-c7 */
	     + MULTIPLY(tmp4, FIX(2.167985692));              /* c1+c13+c5-c9 */

    dataptr[DCTSIZE*1] = (DCTELEM) DESCALE(tmp10, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*3] = (DCTELEM) DESCALE(tmp11, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*5] = (DCTELEM) DESCALE(tmp12, CONST_BITS+PASS1_BITS+1);
    dataptr[DCTSIZE*7] = (DCTELEM) DESCALE(tmp13, CONST_BITS+PASS1_BITS+1);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}